

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

int __thiscall mpt::config::root::assign(root *this,path *dest,value *val)

{
  bool bVar1;
  long lVar2;
  convertable *pcVar3;
  int local_6c;
  int type;
  config_item *curr;
  metatype *m;
  path p;
  value *val_local;
  path *dest_local;
  root *this_local;
  
  if ((dest != (path *)0x0) && (p._24_8_ = val, bVar1 = path::empty(dest), !bVar1)) {
    path::path((path *)&m,dest);
    if (p._24_8_ == 0) {
      lVar2 = mpt_config_item_query(&this->_sub,&m);
      if (lVar2 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        local_6c = 0;
        pcVar3 = &reference<mpt::metatype>::instance((reference<mpt::metatype> *)(lVar2 + 8))->
                  super_convertable;
        if (pcVar3 != (convertable *)0x0) {
          local_6c = convertable::type(pcVar3);
          reference<mpt::metatype>::set_instance
                    ((reference<mpt::metatype> *)(lVar2 + 8),(metatype *)0x0);
        }
        this_local._4_4_ = local_6c;
      }
    }
    else {
      pcVar3 = &metatype::create((value *)p._24_8_)->super_convertable;
      if (pcVar3 == (convertable *)0x0) {
        this_local._4_4_ = -3;
      }
      else {
        lVar2 = mpt_config_item_reserve(&this->_sub,&m);
        if (lVar2 == 0) {
          (*pcVar3->_vptr_convertable[1])();
          this_local._4_4_ = -4;
        }
        else {
          reference<mpt::metatype>::set_instance
                    ((reference<mpt::metatype> *)(lVar2 + 8),(metatype *)pcVar3);
          this_local._4_4_ = convertable::type(pcVar3);
        }
      }
    }
    path::~path((path *)&m);
    return this_local._4_4_;
  }
  return -1;
}

Assistant:

int config::root::assign(const path *dest, const value *val)
{
	// no 'self' or 'root' element(s)
	if (!dest || dest->empty()) {
		return BadArgument;
	}
	// find existing
	path p = *dest;
	metatype *m;
	config_item *curr;
	
	if (!val) {
		if (!(curr = mpt_config_item_query(&_sub, &p))) {
			return 0;
		}
		int type = 0;
		if ((m = curr->instance())) {
			type = m->type();
			curr->set_instance(0);
		}
		return type;
	}
	if (!(m = metatype::create(*val))) {
		return BadType;
	}
	if (!(curr = mpt_config_item_reserve(&_sub, &p))) {
		m->unref();
		return BadOperation;
	}
	curr->set_instance(m);
	return m->type();
}